

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcphuff.c
# Opt level: O3

void emit_bits(phuff_entropy_ptr entropy,uint code,int size)

{
  size_t *psVar1;
  j_compress_ptr pjVar2;
  jpeg_error_mgr *pjVar3;
  JOCTET *pJVar4;
  bool bVar5;
  size_t sVar6;
  int iVar7;
  int iVar8;
  
  iVar7 = entropy->put_bits;
  if (size == 0) {
    pjVar2 = entropy->cinfo;
    pjVar3 = pjVar2->err;
    pjVar3->msg_code = 0x28;
    (*pjVar3->error_exit)((j_common_ptr)pjVar2);
  }
  if (entropy->gather_statistics == 0) {
    iVar7 = iVar7 + size;
    sVar6 = (ulong)(code & ~(uint)(-1L << ((byte)size & 0x3f))) << (0x18U - (char)iVar7 & 0x3f) |
            entropy->put_buffer;
    iVar8 = iVar7;
    if (7 < iVar7) {
      do {
        pJVar4 = entropy->next_output_byte;
        entropy->next_output_byte = pJVar4 + 1;
        *pJVar4 = (JOCTET)(sVar6 >> 0x10);
        psVar1 = &entropy->free_in_buffer;
        *psVar1 = *psVar1 - 1;
        if (*psVar1 == 0) {
          dump_buffer(entropy);
        }
        if ((~(uint)sVar6 & 0xff0000) == 0) {
          pJVar4 = entropy->next_output_byte;
          entropy->next_output_byte = pJVar4 + 1;
          *pJVar4 = '\0';
          psVar1 = &entropy->free_in_buffer;
          *psVar1 = *psVar1 - 1;
          if (*psVar1 == 0) {
            dump_buffer(entropy);
          }
        }
        sVar6 = sVar6 << 8;
        iVar7 = iVar8 + -8;
        bVar5 = 0xf < iVar8;
        iVar8 = iVar7;
      } while (bVar5);
    }
    entropy->put_buffer = sVar6;
    entropy->put_bits = iVar7;
  }
  return;
}

Assistant:

LOCAL(void)
emit_bits(phuff_entropy_ptr entropy, unsigned int code, int size)
/* Emit some bits, unless we are in gather mode */
{
  /* This routine is heavily used, so it's worth coding tightly. */
  register size_t put_buffer = (size_t)code;
  register int put_bits = entropy->put_bits;

  /* if size is 0, caller used an invalid Huffman table entry */
  if (size == 0)
    ERREXIT(entropy->cinfo, JERR_HUFF_MISSING_CODE);

  if (entropy->gather_statistics)
    return;                     /* do nothing if we're only getting stats */

  put_buffer &= (((size_t)1) << size) - 1; /* mask off any extra bits in code */

  put_bits += size;             /* new number of bits in buffer */

  put_buffer <<= 24 - put_bits; /* align incoming bits */

  put_buffer |= entropy->put_buffer; /* and merge with old buffer contents */

  while (put_bits >= 8) {
    int c = (int)((put_buffer >> 16) & 0xFF);

    emit_byte(entropy, c);
    if (c == 0xFF) {            /* need to stuff a zero byte? */
      emit_byte(entropy, 0);
    }
    put_buffer <<= 8;
    put_bits -= 8;
  }

  entropy->put_buffer = put_buffer; /* update variables */
  entropy->put_bits = put_bits;
}